

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gecko.cpp
# Opt level: O2

void __thiscall
MyProgress::beginiter(MyProgress *this,Graph *param_1,uint iter,uint maxiter,uint window)

{
  int iVar1;
  ostream *poVar2;
  
  poVar2 = std::operator<<((ostream *)&std::cerr,"i = ");
  iVar1 = width(maxiter);
  *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = (long)iVar1;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"/");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"  n = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"  ");
  return;
}

Assistant:

void beginiter(const Graph*, unsigned int iter, unsigned int maxiter, unsigned int window) const
  {
    std::cerr << "i = " << std::setw(width(maxiter)) << iter << "/" << maxiter << "  n = " << window << "  ";
  }